

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_sync_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::PriceSyncTest_TestNotEqualsDifferent_Test::TestBody
          (PriceSyncTest_TestNotEqualsDifferent_Test *this)

{
  bool bVar1;
  element_type *peVar2;
  char *message;
  AssertHelper local_a8;
  Message local_a0;
  PriceSync local_98 [56];
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  undefined1 local_40 [8];
  ByteBuffer buffer;
  PriceSyncTest_TestNotEqualsDifferent_Test *this_local;
  
  PriceSyncTest::createBuffer((PriceSyncTest *)local_40);
  bidfx_public_api::tools::ByteBuffer::SetByte((ulong)local_40,'\x01');
  peVar2 = std::
           __shared_ptr_access<bidfx_public_api::tools::BufferInflator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<bidfx_public_api::tools::BufferInflator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&(this->super_PriceSyncTest).buffer_inflator);
  bidfx_public_api::price::pixie::PriceSync::PriceSync(local_98,(ByteBuffer *)local_40,peVar2);
  testing::internal::
  CmpHelperNE<bidfx_public_api::price::pixie::PriceSync,bidfx_public_api::price::pixie::PriceSync>
            ((internal *)local_60,"price_sync","PriceSync(buffer, *buffer_inflator)",
             &(this->super_PriceSyncTest).price_sync,local_98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_sync_test.cpp"
               ,0x31,message);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer((ByteBuffer *)local_40);
  return;
}

Assistant:

TEST_F(PriceSyncTest, TestNotEqualsDifferent)
{
    ByteBuffer buffer = createBuffer();
    buffer.SetByte(1, 33);
    EXPECT_NE(price_sync, PriceSync(buffer, *buffer_inflator));
}